

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O0

string * cmIfCommandError_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                   *args)

{
  bool bVar1;
  pointer this;
  string *str;
  string local_60;
  __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  local_40;
  __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  local_38;
  const_iterator i;
  allocator local_1a;
  undefined1 local_19;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *local_18;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *args_local;
  string *err;
  
  local_19 = 0;
  local_18 = args;
  args_local = (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
               __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"given arguments:\n ",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  local_38._M_current =
       (cmExpandedCommandArgument *)
       std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::begin
                 (local_18);
  while( true ) {
    local_40._M_current =
         (cmExpandedCommandArgument *)
         std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                   (local_18);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    this = __gnu_cxx::
           __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
           ::operator->(&local_38);
    str = cmExpandedCommandArgument::GetValue_abi_cxx11_(this);
    cmOutputConverter::EscapeForCMake(&local_60,str);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    __gnu_cxx::
    __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
    ::operator++(&local_38);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  return __return_storage_ptr__;
}

Assistant:

static std::string cmIfCommandError(
  std::vector<cmExpandedCommandArgument> const& args)
{
  std::string err = "given arguments:\n ";
  for(std::vector<cmExpandedCommandArgument>::const_iterator i = args.begin();
      i != args.end(); ++i)
    {
    err += " ";
    err += cmOutputConverter::EscapeForCMake(i->GetValue());
    }
  err += "\n";
  return err;
}